

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::DestinationCast_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *type)

{
  bool bVar1;
  allocator<char> local_8d [13];
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Type local_40;
  Type *local_20;
  Type *type_local;
  CSharpGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  bVar1 = IsSeries(type);
  if (bVar1) {
    Type::VectorType(&local_40,local_20);
    DestinationCast_abi_cxx11_(__return_storage_ptr__,this,&local_40);
  }
  else {
    bVar1 = IsEnum(local_20);
    if (bVar1) {
      NamespacedName_abi_cxx11_(&local_80,this,&local_20->enum_def->super_Definition);
      std::operator+(&local_60,"(",&local_80);
      std::operator+(__return_storage_ptr__,&local_60,")");
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",local_8d);
      std::allocator<char>::~allocator(local_8d);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DestinationCast(const Type &type) const {
    if (IsSeries(type)) {
      return DestinationCast(type.VectorType());
    } else {
      if (IsEnum(type)) return "(" + NamespacedName(*type.enum_def) + ")";
    }
    return "";
  }